

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::IntermediateNode::output
          (IntermediateNode *this,ostream *out,bool multiline,int indent)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>
  childIter;
  anon_class_24_3_1723b358 outp;
  bool local_61;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
  local_60;
  int local_54;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
  local_50;
  anon_class_24_3_1723b358 local_48;
  Node **x;
  
  local_61 = multiline;
  local_54 = indent;
  (*(this->super_Node)._vptr_Node[8])(&local_50,this);
  Lib::
  iterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node**>>
            ((Lib *)&local_60,&local_50);
  Lib::
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
  ::~VirtualIterator(&local_50);
  if (((this->super_Node)._term._content & 3) != 2) {
    poVar2 = Kernel::operator<<(out,&(this->super_Node)._term);
    std::operator<<(poVar2," ; ");
  }
  poVar2 = std::operator<<(out,"S");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," -> ");
  iVar1 = (*(local_60._core)->_vptr_IteratorCore[3])();
  x = (Node **)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(local_60._core)->_vptr_IteratorCore[2])();
  if ((char)iVar1 == '\0') {
    (*(*x)->_vptr_Node[7])(*x,out,multiline,(ulong)(uint)indent);
  }
  else if (multiline) {
    local_48.indent = &local_54;
    local_48.multiline = &local_61;
    local_48.out = out;
    std::operator<<(out,"[");
    output::anon_class_24_3_1723b358::operator()(&local_48,x);
    while( true ) {
      iVar1 = (*(local_60._core)->_vptr_IteratorCore[2])();
      if ((char)iVar1 == '\0') break;
      iVar1 = (*(local_60._core)->_vptr_IteratorCore[3])();
      output::anon_class_24_3_1723b358::operator()
                (&local_48,(Node **)CONCAT44(extraout_var_00,iVar1));
    }
    std::endl<char,std::char_traits<char>>(out);
    Lib::Output::Multiline<int>::outputIndent(out,local_54 + 1);
    std::operator<<(out,"]");
  }
  else {
    std::operator<<(out,"[ ");
    (*(*x)->_vptr_Node[7])(*x,out,0,0);
    while( true ) {
      iVar1 = (*(local_60._core)->_vptr_IteratorCore[2])();
      if ((char)iVar1 == '\0') break;
      poVar2 = std::operator<<(out," | ");
      iVar1 = (*(local_60._core)->_vptr_IteratorCore[3])();
      (**(code **)(**(long **)CONCAT44(extraout_var_01,iVar1) + 0x38))
                (*(long **)CONCAT44(extraout_var_01,iVar1),poVar2,0,0);
    }
    std::operator<<(out," ]");
  }
  Lib::
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
  ::~VirtualIterator(&local_60);
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::IntermediateNode::output(std::ostream& out, bool multiline, int indent) const 
{
  // TODO const version of allChildren
  auto childIter = iterTraits(((IntermediateNode*)this)->allChildren());
  if (!this->term().isEmpty()) {
    out << this->term()
        << " ; ";
  }
  out << "S" << this->childVar << " -> ";

  auto first = childIter.next();
  auto brackets = childIter.hasNext();
  if (brackets) {


    if (multiline) {
      auto outp = [&](Node** x) { 
        out << std::endl; 
        Output::Multiline<int>::outputIndent(out, indent + 1);
        out << "| ";
        (*x)->output(out, multiline, indent + 1);
      };
      out << "[";
      outp(first);
      while (childIter.hasNext()) {
        outp(childIter.next());
      }
      out << std::endl; 
      Output::Multiline<int>::outputIndent(out, indent + 1);
      out << "]";

    } else {
      out << "[ ";
      out << **first;
      while (childIter.hasNext()) {
        out <<  " | " << **childIter.next();
      } 
      out << " ]";
    }


  } else {
    (*first)->output(out, multiline, indent);
  }

}